

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpRelaxation.cpp
# Opt level: O0

void __thiscall HighsLpRelaxation::removeObsoleteRows(HighsLpRelaxation *this,bool notifyPool)

{
  HighsInt HVar1;
  HighsBasis *pHVar2;
  const_reference pvVar3;
  reference pvVar4;
  byte in_SIL;
  vector<int,_std::allocator<int>_> *in_RDI;
  HighsInt i;
  HighsInt ndelcuts;
  vector<int,_std::allocator<int>_> deletemask;
  HighsInt nummodelrows;
  HighsInt nlprows;
  vector<int,_std::allocator<int>_> *in_stack_00000090;
  HighsInt in_stack_0000009c;
  HighsLpRelaxation *in_stack_000000a0;
  size_type in_stack_ffffffffffffffb8;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffc0;
  int local_38;
  int cut;
  HighsCutPool *in_stack_ffffffffffffffd0;
  
  HVar1 = numRows((HighsLpRelaxation *)0x605ea1);
  local_38 = getNumModelRows((HighsLpRelaxation *)0x605eaf);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x605ebd);
  cut = 0;
  for (; local_38 != HVar1; local_38 = local_38 + 1) {
    pHVar2 = Highs::getBasis((Highs *)&(in_RDI->super__Vector_base<int,_std::allocator<int>_>).
                                       _M_impl.super__Vector_impl_data._M_finish);
    pvVar3 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                       (&pHVar2->row_status,(long)local_38);
    if (*pvVar3 == kBasic) {
      if (cut == 0) {
        std::vector<int,_std::allocator<int>_>::resize
                  (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      }
      cut = cut + 1;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)&stack0xffffffffffffffd0,
                          (long)local_38);
      *pvVar4 = 1;
      if ((in_SIL & 1) != 0) {
        std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
                  ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)
                   0x605f7e);
        std::vector<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_>::operator[]
                  ((vector<HighsLpRelaxation::LpRow,_std::allocator<HighsLpRelaxation::LpRow>_> *)
                   &in_RDI[0x368].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish,(long)local_38);
        HighsCutPool::lpCutRemoved(in_stack_ffffffffffffffd0,cut);
      }
    }
  }
  removeCuts(in_stack_000000a0,in_stack_0000009c,in_stack_00000090);
  std::vector<int,_std::allocator<int>_>::~vector(in_RDI);
  return;
}

Assistant:

void HighsLpRelaxation::removeObsoleteRows(bool notifyPool) {
  HighsInt nlprows = numRows();
  HighsInt nummodelrows = getNumModelRows();
  std::vector<HighsInt> deletemask;

  HighsInt ndelcuts = 0;
  for (HighsInt i = nummodelrows; i != nlprows; ++i) {
    assert(lprows[i].origin == LpRow::Origin::kCutPool);
    if (lpsolver.getBasis().row_status[i] == HighsBasisStatus::kBasic) {
      if (ndelcuts == 0) deletemask.resize(nlprows);
      ++ndelcuts;
      deletemask[i] = 1;
      if (notifyPool) mipsolver.mipdata_->cutpool.lpCutRemoved(lprows[i].index);
    }
  }

  removeCuts(ndelcuts, deletemask);
}